

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxsc.cpp
# Opt level: O2

int __thiscall ktxSupercompressor::main(ktxSupercompressor *this,int argc,char **argv)

{
  string *path;
  commandOptions *pcVar1;
  ktxTexture2 *pkVar2;
  size_type sVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  ktx_error_code_e kVar7;
  FILE *__stream;
  long lVar8;
  int *piVar9;
  ostream *poVar10;
  FILE *__stream_00;
  ulong uVar11;
  char *pcVar12;
  pointer pbVar13;
  ktxTexture2 *texture;
  uint local_284;
  ktxSupercompressor *local_280;
  path local_278;
  ulong local_250;
  string infile;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  string tmpfile;
  undefined8 local_1d8 [4];
  path outputPath;
  
  texture = (ktxTexture2 *)0x0;
  tmpfile._M_dataplus._M_p = (pointer)&tmpfile.field_2;
  tmpfile._M_string_length = 0;
  tmpfile.field_2._M_local_buf[0] = '\0';
  ktxApp::processCommandLine((ktxApp *)this,argc,argv,eAllowStdin,eNone);
  (*(this->super_scApp).super_ktxApp._vptr_ktxApp[4])(this);
  pbVar13 = (this->options).super_commandOptions.super_commandOptions.infiles.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  path = &(this->options).super_commandOptions.super_commandOptions.outfile;
  pcVar1 = &this->options;
  local_250 = 0;
  local_284 = 2;
  __stream_00 = (FILE *)0x0;
  local_280 = this;
  do {
    if ((this->options).super_commandOptions.super_commandOptions.infiles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish <= pbVar13) {
LAB_0010798a:
      std::__cxx11::string::~string((string *)&tmpfile);
      return (int)local_250;
    }
    std::__cxx11::string::string((string *)&infile,(string *)pbVar13);
    iVar5 = std::__cxx11::string::compare((char *)&infile);
    __stream = _stdin;
    if (iVar5 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&outputPath,"rb",(allocator<char> *)&local_278);
      __stream = fopen(infile._M_dataplus._M_p,
                       (char *)CONCAT71(outputPath._M_pathname._M_dataplus._M_p._1_7_,
                                        (char)outputPath._M_pathname._M_dataplus._M_p));
      std::__cxx11::string::~string((string *)&outputPath);
    }
    if (__stream == (FILE *)0x0) {
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                (string *)&(this->super_scApp).super_ktxApp.name);
      poVar10 = std::operator<<(poVar10," could not open input file \"");
      iVar5 = std::__cxx11::string::compare((char *)&infile);
      if (iVar5 == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&outputPath,"stdin",(allocator<char> *)&local_278);
      }
      else {
        std::__cxx11::string::string((string *)&outputPath,(string *)&infile);
      }
      poVar10 = std::operator<<(poVar10,(string *)&outputPath);
      poVar10 = std::operator<<(poVar10,"\". ");
      piVar9 = __errno_location();
      pcVar12 = strerror(*piVar9);
      poVar10 = std::operator<<(poVar10,pcVar12);
      std::endl<char,std::char_traits<char>>(poVar10);
      std::__cxx11::string::~string((string *)&outputPath);
LAB_0010793b:
      std::__cxx11::string::~string((string *)&infile);
      uVar11 = (ulong)local_284;
      if (__stream_00 != (FILE *)0x0) {
LAB_00107950:
        fclose(__stream_00);
      }
      local_250 = uVar11;
      if (tmpfile._M_string_length != 0) {
        unlink(tmpfile._M_dataplus._M_p);
      }
      if ((this->options).super_commandOptions.super_commandOptions.outfile._M_string_length != 0) {
        unlinkUTF8(path);
      }
      goto LAB_0010798a;
    }
    __stream_00 = _stdout;
    if ((this->options).useStdout != true) {
      if ((this->options).super_commandOptions.super_commandOptions.outfile._M_string_length == 0) {
        lVar8 = std::__cxx11::string::find_last_of((char *)&infile,0x119d4e);
        if (lVar8 == -1) {
          local_278._M_pathname._M_dataplus._M_p = (pointer)&local_278._M_pathname.field_2;
          local_278._M_pathname._M_string_length = 0;
          local_278._M_pathname.field_2._M_allocated_capacity =
               local_278._M_pathname.field_2._M_allocated_capacity & 0xffffffffffffff00;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_278,(ulong)&infile);
        }
        std::operator+(&outputPath._M_pathname,&local_278._M_pathname,"ktxsc.tmp.XXXXXX");
        std::__cxx11::string::operator=((string *)&tmpfile,(string *)&outputPath);
        std::__cxx11::string::~string((string *)&outputPath);
        std::__cxx11::string::~string((string *)&local_278);
        iVar5 = mkstemp(tmpfile._M_dataplus._M_p);
        __stream_00 = fdopen(iVar5,"wb");
      }
      else {
        std::__cxx11::string::string((string *)&local_228,(string *)path);
        local_278._M_pathname._M_dataplus._M_p = (pointer)&local_278._M_pathname.field_2;
        if (local_228 == &local_218) {
          local_278._M_pathname.field_2._8_8_ = local_218._8_8_;
        }
        else {
          local_278._M_pathname._M_dataplus._M_p = (pointer)local_228;
        }
        local_278._M_pathname.field_2._M_allocated_capacity._1_7_ =
             local_218._M_allocated_capacity._1_7_;
        local_278._M_pathname.field_2._M_local_buf[0] = local_218._M_local_buf[0];
        local_278._M_pathname._M_string_length = local_220;
        local_220 = 0;
        local_218._M_local_buf[0] = '\0';
        local_228 = &local_218;
        std::filesystem::__cxx11::path::path(&outputPath,&local_278._M_pathname,auto_format);
        std::__cxx11::string::~string((string *)&local_278);
        std::__cxx11::string::~string((string *)&local_228);
        cVar4 = std::filesystem::__cxx11::path::has_parent_path();
        if (cVar4 != '\0') {
          std::filesystem::__cxx11::path::parent_path();
          std::filesystem::create_directories(&local_278);
          std::filesystem::__cxx11::path::~path(&local_278);
        }
        __stream_00 = (FILE *)ktxApp::fopen_write_if_not_exists(path);
        std::filesystem::__cxx11::path::~path(&outputPath);
      }
    }
    if (__stream_00 == (FILE *)0x0) {
      piVar9 = __errno_location();
      if (*piVar9 == 0x11) {
        cVar4 = (this->options).force;
        if ((bool)cVar4 == false) {
          iVar5 = fileno(_stdin);
          iVar5 = isatty(iVar5);
          if (iVar5 != 0) {
            poVar10 = std::operator<<((ostream *)&std::cout,"Output file ");
            poVar10 = std::operator<<(poVar10,(string *)path);
            std::operator<<(poVar10," exists. Overwrite? [Y or n] ");
            std::operator>>((istream *)&std::cin,(char *)&outputPath);
            cVar4 = '\0';
            if ((char)outputPath._M_pathname._M_dataplus._M_p == 'Y') {
              cVar4 = '\x01';
            }
          }
        }
        if (cVar4 != '\0') {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&outputPath,"wb",(allocator<char> *)&local_278);
          __stream_00 = (FILE *)fopenUTF8(path,&outputPath._M_pathname);
          std::__cxx11::string::~string((string *)&outputPath);
          if (__stream_00 != (FILE *)0x0) goto LAB_00107460;
        }
      }
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                (string *)&(this->super_scApp).super_ktxApp.name);
      poVar10 = std::operator<<(poVar10," could not open output file \"");
      if ((this->options).useStdout == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&outputPath,"stdout",(allocator<char> *)&local_278);
      }
      else {
        std::__cxx11::string::string((string *)&outputPath,(string *)path);
      }
      poVar10 = std::operator<<(poVar10,(string *)&outputPath);
      poVar10 = std::operator<<(poVar10,"\". ");
      pcVar12 = strerror(*piVar9);
      poVar10 = std::operator<<(poVar10,pcVar12);
      std::endl<char,std::char_traits<char>>(poVar10);
      std::__cxx11::string::~string((string *)&outputPath);
      __stream_00 = (FILE *)0x0;
      goto LAB_0010793b;
    }
LAB_00107460:
    iVar5 = ktxTexture2_CreateFromStdioStream(__stream,1,&texture);
    if (iVar5 != 0) {
      if (iVar5 == 0xf) {
        poVar10 = std::operator<<((ostream *)&std::cerr,(string *)&infile);
        poVar10 = std::operator<<(poVar10," is not a KTX v2 file.");
      }
      else {
        poVar10 = std::operator<<((ostream *)&std::cerr,
                                  (string *)&(this->super_scApp).super_ktxApp.name);
        poVar10 = std::operator<<(poVar10," failed to create ktxTexture from ");
        poVar10 = std::operator<<(poVar10,(string *)&infile);
        poVar10 = std::operator<<(poVar10,": ");
        pcVar12 = (char *)ktxErrorString(iVar5);
        poVar10 = std::operator<<(poVar10,pcVar12);
      }
      std::endl<char,std::char_traits<char>>(poVar10);
      goto LAB_0010793b;
    }
    fclose(__stream);
    if (texture->classId != ktxTexture2_c) {
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                (string *)&(this->super_scApp).super_ktxApp.name);
      poVar10 = std::operator<<(poVar10,": ");
      pcVar12 = "Only KTX texture version 2 files can be supercompressed.";
LAB_0010784c:
      poVar10 = std::operator<<(poVar10,pcVar12);
      std::endl<char,std::char_traits<char>>(poVar10);
      local_284 = 1;
      goto LAB_0010793b;
    }
    if (texture->supercompressionScheme != KTX_SS_BEGIN_RANGE) {
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                (string *)&(this->super_scApp).super_ktxApp.name);
      poVar10 = std::operator<<(poVar10,": ");
      pcVar12 = "Cannot supercompress already supercompressed files.";
      goto LAB_0010784c;
    }
    if ((((this->options).super_commandOptions.etc1s != 0 ||
          (this->options).super_commandOptions.astc != 0) ||
        ((this->options).super_commandOptions.bopts.super_ktxBasisParams.uastc == true)) &&
       (texture->isCompressed == true)) {
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                (string *)&(this->super_scApp).super_ktxApp.name);
      poVar10 = std::operator<<(poVar10,": ");
      poVar10 = std::operator<<(poVar10,"Cannot encode already block-compressed textures ");
      pcVar12 = "to ASTC, Basis Universal or UASTC.";
      goto LAB_0010784c;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&outputPath);
    ktxApp::writeId((ktxApp *)this,(ostream *)outputPath._M_pathname.field_2._M_local_buf,true);
    ktxHashList_DeleteKVPair(&texture->kvDataHead,"KTXwriter");
    pkVar2 = texture;
    std::__cxx11::stringbuf::str();
    sVar3 = local_278._M_pathname._M_string_length;
    std::__cxx11::stringbuf::str();
    ktxHashList_AddKVPair(&pkVar2->kvDataHead,"KTXwriter",(int)sVar3 + 1,local_1d8[0]);
    std::__cxx11::string::~string((string *)local_1d8);
    std::__cxx11::string::~string((string *)&local_278);
    uVar6 = scApp::encode(&local_280->super_scApp,texture,
                          &(pcVar1->super_commandOptions).inputSwizzle,&infile);
    if (uVar6 != 0) {
      uVar11 = (ulong)uVar6;
      this = local_280;
LAB_001077fb:
      std::__cxx11::stringstream::~stringstream((stringstream *)&outputPath);
      std::__cxx11::string::~string((string *)&infile);
      goto LAB_00107950;
    }
    kVar7 = (*texture->vtbl->WriteToStdioStream)((ktxTexture *)texture,(FILE *)__stream_00);
    this = local_280;
    if (kVar7 != KTX_SUCCESS) {
      poVar10 = std::operator<<((ostream *)&std::cerr,
                                (string *)&(local_280->super_scApp).super_ktxApp.name);
      poVar10 = std::operator<<(poVar10," failed to write KTX file; ");
      pcVar12 = (char *)ktxErrorString(kVar7);
LAB_001077e5:
      poVar10 = std::operator<<(poVar10,pcVar12);
      std::endl<char,std::char_traits<char>>(poVar10);
      uVar11 = 2;
      goto LAB_001077fb;
    }
    fclose(__stream_00);
    this = local_280;
    if (((local_280->options).super_commandOptions.super_commandOptions.outfile._M_string_length ==
         0) && ((local_280->options).useStdout == false)) {
      if ((tmpfile._M_string_length == 0) || (infile._M_string_length == 0)) {
        __assert_fail("tmpfile.size() > 0 && infile.length()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktxsc/ktxsc.cpp"
                      ,300,"virtual int ktxSupercompressor::main(int, char **)");
      }
      iVar5 = rename(tmpfile._M_dataplus._M_p,infile._M_dataplus._M_p);
      if (iVar5 != 0) {
        poVar10 = std::operator<<((ostream *)&std::cerr,
                                  (string *)&(this->super_scApp).super_ktxApp.name);
        poVar10 = std::operator<<(poVar10,": rename of \"");
        poVar10 = std::operator<<(poVar10,(string *)&tmpfile);
        poVar10 = std::operator<<(poVar10,"\" to \"");
        poVar10 = std::operator<<(poVar10,(string *)&infile);
        poVar10 = std::operator<<(poVar10,"\" failed: ");
        piVar9 = __errno_location();
        pcVar12 = strerror(*piVar9);
        goto LAB_001077e5;
      }
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&outputPath);
    std::__cxx11::string::~string((string *)&infile);
    pbVar13 = pbVar13 + 1;
  } while( true );
}

Assistant:

int
ktxSupercompressor::main(int argc, char* argv[])
{
    FILE *inf, *outf = nullptr;
    KTX_error_code result;
    ktxTexture2* texture = 0;
    int exitCode = 0;
    string tmpfile;

    processCommandLine(argc, argv, eAllowStdin);
    validateOptions();

    std::vector<string>::const_iterator it;
    for (it = options.infiles.begin(); it < options.infiles.end(); it++) {
        string infile = *it;

        if (infile.compare("-") == 0) {
            inf = stdin;
#if defined(_WIN32)
            /* Set "stdin" to have binary mode */
            (void)_setmode( _fileno( stdin ), _O_BINARY );
#endif
        } else {
            inf = fopenUTF8(infile, "rb");
        }

        if (inf) {
            if (options.useStdout) {
                outf = stdout;
#if defined(_WIN32)
                /* Set "stdout" to have binary mode */
                (void)_setmode( _fileno( stdout ), _O_BINARY );
#endif
            } else if (options.outfile.length()) {
                const auto outputPath = filesystem::path(DecodeUTF8Path(options.outfile));
                if (outputPath.has_parent_path())
                    filesystem::create_directories(outputPath.parent_path());
                outf = fopen_write_if_not_exists(options.outfile);
            } else {
                // Make a temporary file in the same directory as the source
                // file to avoid cross-device rename issues later.
                tmpfile = dir_name(infile) + "ktxsc.tmp.XXXXXX";
#if defined(_WIN32)
                // Despite receiving size() the debug CRT version of mktemp_s
                // asserts that the string template is NUL terminated.
                tmpfile.push_back('\0');
                if (_wmktemp_s(&DecodeUTF8Path(tmpfile)[0], tmpfile.size()) == 0)
                    outf = fopenUTF8(tmpfile, "wb");
#else
                int fd_tmp = mkstemp(&tmpfile[0]);
                outf = fdopen(fd_tmp, "wb");
#endif
            }

            if (!outf && errno == EEXIST) {
                bool force = options.force;
                if (!force) {
                    if (isatty(fileno(stdin))) {
                        char answer;
                        cout << "Output file " << options.outfile
                             << " exists. Overwrite? [Y or n] ";
                        cin >> answer;
                        if (answer == 'Y') {
                            force = true;
                        }
                    }
                }
                if (force) {
                    outf = fopenUTF8(options.outfile, "wb");
                }
            }

            if (outf) {
                result = ktxTexture2_CreateFromStdioStream(inf,
                                        KTX_TEXTURE_CREATE_LOAD_IMAGE_DATA_BIT,
                                        &texture);
                if (result == KTX_UNKNOWN_FILE_FORMAT) {
                    cerr << infile << " is not a KTX v2 file." << endl;
                    exitCode = 2;
                    goto cleanup;
                } else if (result != KTX_SUCCESS) {
                    cerr << name
                         << " failed to create ktxTexture from " << infile
                         << ": " << ktxErrorString(result) << endl;
                    exitCode = 2;
                    goto cleanup;
                }
                (void)fclose(inf);

                if (texture->classId != ktxTexture2_c) {
                    cerr << name << ": "
                         << "Only KTX texture version 2 files can be supercompressed."
                         << endl;
                    exitCode = 1;
                    goto cleanup;
                }
                if (texture->supercompressionScheme != KTX_SS_NONE) {
                    cerr << name << ": "
                         << "Cannot supercompress already supercompressed files."
                         << endl;
                    exitCode = 1;
                    goto cleanup;
                }
                if ((options.astc || options.etc1s || options.bopts.uastc) && texture->isCompressed) {
                    cerr << name << ": "
                         << "Cannot encode already block-compressed textures "
                         << "to ASTC, Basis Universal or UASTC."
                         << endl;
                    exitCode = 1;
                    goto cleanup;
                }

                // Modify the writer metadata.
                stringstream writer;
                writeId(writer, true);
                ktxHashList_DeleteKVPair(&texture->kvDataHead, KTX_WRITER_KEY);
                ktxHashList_AddKVPair(&texture->kvDataHead, KTX_WRITER_KEY,
                                      (ktx_uint32_t)writer.str().length() + 1,
                                      writer.str().c_str());

                exitCode = encode(texture, options.inputSwizzle, infile);
                if (exitCode)
                    goto cleanup;
                result = ktxTexture_WriteToStdioStream(ktxTexture(texture), outf);
                if (result != KTX_SUCCESS) {
                    cerr << name
                         << " failed to write KTX file; "
                         << ktxErrorString(result) << endl;
                    exitCode = 2;
                    goto cleanup;
                }
                (void)fclose(outf);
                if (!options.outfile.length() && !options.useStdout) {
                    // Move the new file over the original.
                    assert(tmpfile.size() > 0 && infile.length());
#if defined(_WIN32)
                    // Windows' rename() fails if the destination file exists!
                    if (!MoveFileExW(DecodeUTF8Path(tmpfile).c_str(), DecodeUTF8Path(infile).c_str(),
                                     MOVEFILE_REPLACE_EXISTING))
#else
                    if (rename(tmpfile.c_str(), infile.c_str()))
#endif
                    {
                        cerr << name
                             << ": rename of \"" << tmpfile << "\" to \""
                             << infile << "\" failed: "
                             << strerror(errno) << endl;
                        exitCode = 2;
                        goto cleanup;
                    }
                }
            } else {
                cerr << name
                     << " could not open output file \""
                     << (options.useStdout ? "stdout" : options.outfile) << "\". "
                     << strerror(errno) << endl;
                exitCode = 2;
                goto cleanup;
            }
        } else {
            cerr << name
                 << " could not open input file \""
                 << (infile.compare("-") == 0 ? "stdin" : infile) << "\". "
                 << strerror(errno) << endl;
            exitCode = 2;
            goto cleanup;
        }
    }
    return 0;

cleanup:
    if (outf) { // Windows debug CRT fclose asserts that outf != nullptr...
        (void)fclose(outf); // N.B Windows refuses to unlink an open file.
    }
    if (tmpfile.size() > 0) (void)unlinkUTF8(tmpfile);
    if (options.outfile.length()) (void)unlinkUTF8(options.outfile);
    return exitCode;
}